

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilClearTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::DepthStencilClearCase::init(DepthStencilClearCase *this,EVP_PKEY_CTX *ctx)

{
  TestLog *log;
  RenderContext *renderCtx;
  int extraout_EAX;
  ShaderProgram *pSVar1;
  TestError *this_00;
  allocator<char> local_132;
  allocator<char> local_131;
  string local_130;
  string local_110;
  ProgramSources local_f0;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pSVar1 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,
             "#version 300 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,&local_131);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,
             "#version 300 es\nuniform mediump vec4 u_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = u_color;\n}\n"
             ,&local_132);
  glu::makeVtxFragSources(&local_f0,&local_110,&local_130);
  glu::ShaderProgram::ShaderProgram(pSVar1,renderCtx,&local_f0);
  this->m_visProgram = pSVar1;
  glu::ProgramSources::~ProgramSources(&local_f0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  if ((this->m_visProgram->m_program).m_info.linkOk != false) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    return extraout_EAX;
  }
  glu::operator<<(log,this->m_visProgram);
  pSVar1 = this->m_visProgram;
  if (pSVar1 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(pSVar1);
  }
  operator_delete(pSVar1,0xd0);
  this->m_visProgram = (ShaderProgram *)0x0;
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fDepthStencilClearTests.cpp"
             ,0xbe);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void DepthStencilClearCase::init (void)
{
	TestLog& log = m_testCtx.getLog();

	m_visProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(
			// Vertex shader.
			"#version 300 es\n"
			"in highp vec4 a_position;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = a_position;\n"
			"}\n",

			// Fragment shader.
			"#version 300 es\n"
			"uniform mediump vec4 u_color;\n"
			"layout(location = 0) out mediump vec4 o_color;\n"
			"void main (void)\n"
			"{\n"
			"	o_color = u_color;\n"
			"}\n"));

	if (!m_visProgram->isOk())
	{
		log << *m_visProgram;
		delete m_visProgram;
		m_visProgram = DE_NULL;
		TCU_FAIL("Compile failed");
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}